

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O3

char * alcboolString(ALCboolean x)

{
  char *pcVar1;
  int iVar2;
  undefined7 in_register_00000039;
  
  iVar2 = (int)CONCAT71(in_register_00000039,x);
  if (iVar2 == 1) {
    return "ALC_TRUE";
  }
  if (iVar2 == 0) {
    return "ALC_FALSE";
  }
  pcVar1 = sprintf_alloc("0x%X",(ulong)(uint)(int)x);
  return pcVar1;
}

Assistant:

const char *alcboolString(const ALCboolean x)
{
    switch (x) {
        case ALC_TRUE: return "ALC_TRUE";
        case ALC_FALSE: return "ALC_FALSE";
        default: break;
    }

    return sprintf_alloc("0x%X", (uint) x);
}